

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_helo_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  CURLcode local_1c;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  if (smtpcode / 100 == 2) {
    smtp_state(data,SMTP_STOP);
  }
  else {
    Curl_failf(data,"Remote access denied: %d",(ulong)(uint)smtpcode);
    local_1c = CURLE_REMOTE_ACCESS_DENIED;
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_state_helo_resp(struct Curl_easy *data, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "Remote access denied: %d", smtpcode);
    result = CURLE_REMOTE_ACCESS_DENIED;
  }
  else
    /* End of connect phase */
    smtp_state(data, SMTP_STOP);

  return result;
}